

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O2

int Secp256K1::hexValue(char hex_digit)

{
  byte bVar1;
  invalid_argument *this;
  
  bVar1 = hex_digit - 0x30;
  if ((bVar1 < 0x37) && ((0x7e0000007e03ffU >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    return (uint)(byte)hex_digit + *(int *)(&DAT_0010e2e4 + (ulong)bVar1 * 4);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"bad hex_digit");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int Secp256K1::hexValue(char hex_digit)
{
    switch (hex_digit) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
        return hex_digit - '0';

    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
        return hex_digit - 'A' + 10;

    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
        return hex_digit - 'a' + 10;
    }
    throw std::invalid_argument("bad hex_digit");
}